

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.c
# Opt level: O3

void BuildTree(char *rawSourceCode)

{
  Lexer *lexer_00;
  longlong *scope_00;
  Token TVar1;
  uint len;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ASTList *params;
  ASTNode *nodes;
  uint totalFuncs;
  ASTNode *__s;
  ASTList *paramItems;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ASTList *pAStack_1a0;
  undefined1 auStack_198 [16];
  Lexer lexer;
  Clock clock;
  Scope scope;
  Runner runner;
  
  pAStack_1a0 = (ASTList *)0x103288;
  StartClock((Clock *)&lexer.currentTokenString);
  lexer_00 = (Lexer *)(auStack_198 + 8);
  pAStack_1a0 = (ASTList *)0x10329a;
  InitLexer(lexer_00,rawSourceCode);
  pAStack_1a0 = (ASTList *)0x1032a2;
  len = CountTotalASTTokens(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032ad;
  ResetLexer(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032b5;
  iVar2 = CountTotalScopes(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032c1;
  ResetLexer(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032c9;
  iVar3 = CountTotalFuncs(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032d4;
  ResetLexer(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032dc;
  iVar4 = CountTotalFuncCalls(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032e7;
  ResetLexer(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032ef;
  uVar5 = CountTotalParamItems(lexer_00);
  pAStack_1a0 = (ASTList *)0x1032fa;
  ResetLexer(lexer_00);
  totalFuncs = iVar4 + iVar3;
  params = (ASTList *)(auStack_198 + (ulong)totalFuncs * -0x20);
  paramItems = (ASTList *)((long)params - ((ulong)uVar5 * 0x18 + 0xf & 0xfffffffffffffff0));
  paramItems[-1].size = 0x10333c;
  paramItems[-1].nodeId = 0;
  InitParams(params,totalFuncs);
  paramItems[-1].size = 0x10334b;
  paramItems[-1].nodeId = 0;
  InitParamItems((ASTListItem *)paramItems,uVar5);
  nodes = (ASTNode *)((long)paramItems - ((ulong)len * 0x38 + 0xf & 0xfffffffffffffff0));
  nodes[-1].meta.funcExpr.params = (ASTList *)0x10336e;
  InitNodes(nodes,len);
  uVar6 = (ulong)(iVar2 + 1);
  __s = (ASTNode *)((long)nodes - (uVar6 * 4 + 0xf & 0xfffffffffffffff0));
  if (-1 < iVar2) {
    lVar7 = uVar6 - 1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_00107090;
    auVar10 = _DAT_00107080;
    do {
      auVar11 = auVar10 ^ _DAT_00107090;
      lVar7 = auVar10._8_8_;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)((long)&__s->type + uVar8) = (int)(auVar10._0_8_ + 1);
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(int *)((long)&__s->id + uVar8) = (int)(lVar7 + 1);
      }
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
      uVar8 = uVar8 + 8;
    } while ((uVar6 * 4 + 4 & 0xfffffffffffffff8) != uVar8);
  }
  scope_00 = &clock.elapsed;
  __s[-1].meta.funcExpr.params = (ASTList *)0x103446;
  InitScope((Scope *)scope_00);
  clock.elapsed._4_4_ = len;
  scope._24_8_ = nodes;
  scope.nodeSpot = iVar2;
  scope.nodes = __s;
  scope.scopes = (int *)params;
  scope.params = paramItems;
  scope.scopeLength = totalFuncs;
  scope.paramsLength = uVar5;
  lVar7 = (long)scope.nodeLength;
  scope.nodeLength = scope.nodeLength + 1;
  TVar1 = (&__s->type)[lVar7];
  __s[-1].meta.funcExpr.params = (ASTList *)0x10349b;
  ParseStmtList((Scope *)scope_00,(Lexer *)(auStack_198 + 8),TVar1,false);
  clock.elapsed._0_4_ = 0;
  __s[-1].meta.funcExpr.params = (ASTList *)0x1034b0;
  EnsureSemantics((Scope *)scope_00,1);
  if (0 < (long)(int)clock.elapsed._4_4_) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      if (((*(uint *)(scope._24_8_ + lVar7) | 8) == 0x68) ||
         (*(uint *)(scope._24_8_ + lVar7) - 0x40 < 0xb)) {
        uVar5 = uVar5 + 1;
      }
      lVar7 = lVar7 + 0x38;
    } while ((long)(int)clock.elapsed._4_4_ * 0x38 - lVar7 != 0);
    uVar6 = (ulong)uVar5;
    __s = (ASTNode *)
          ((long)__s +
          (-(uVar6 + 0xf & 0xfffffffffffffff0) - (uVar6 * 0x18 + 0xf & 0xfffffffffffffff0)));
    if (0 < (int)uVar5) {
      *(undefined8 *)((long)__s + -8) = 0x10352f;
      memset(__s,0,uVar6);
    }
  }
  __s[-1].meta.funcExpr.params = (ASTList *)0x103557;
  InitRunner((Runner *)&scope.paramItems,(Scope *)&clock.elapsed);
  TVar1 = (scope.nodes)->type;
  __s[-1].meta.funcExpr.params = (ASTList *)0x103565;
  Run((Runner *)&scope.paramItems,TVar1);
  __s[-1].meta.funcExpr.params = (ASTList *)0x103571;
  DestroyLexer((Lexer *)(auStack_198 + 8));
  __s[-1].meta.funcExpr.params = (ASTList *)0x10357d;
  DestroyNodes(nodes,len);
  __s[-1].meta.funcExpr.params = (ASTList *)0x103585;
  DestroyScope((Scope *)&clock.elapsed);
  __s[-1].meta.funcExpr.params = (ASTList *)0x103591;
  EndClock((Clock *)&lexer.currentTokenString);
  return;
}

Assistant:

void BuildTree(char* rawSourceCode){
	Clock clock;
	StartClock(&clock);

	DEBUG_PRINT("\n\n------Starting Program------\n");

	// Build Lexer
	Lexer lexer;
	InitLexer(&lexer, rawSourceCode);

	// Pre-allocate memory
	// The heap is 3,000% slower than just using stack
	// memory. So we are pre-allocating the memory
	// using the stack
	int totalNodes = CountTotalASTTokens(&lexer);
	ResetLexer(&lexer);
	int totalScopes = CountTotalScopes(&lexer);
	ResetLexer(&lexer);
	int totalFuncs = CountTotalFuncs(&lexer);
	ResetLexer(&lexer);
	int totalFuncCalls = CountTotalFuncCalls(&lexer);
	ResetLexer(&lexer);
	int totalParamItems = CountTotalParamItems(&lexer);
	ResetLexer(&lexer);

	// Pre-allocate the different param lists
	ASTList params[totalFuncs + totalFuncCalls];
	ASTListItem paramItems[totalParamItems];
	InitParams(params, totalFuncs + totalFuncCalls);
	InitParamItems(paramItems, totalParamItems);

	// Pre-allocate the different variable types
	ASTNode nodes[totalNodes];
	InitNodes(nodes, totalNodes);

	// Pre-allocate the different scopes
	int scopes[totalScopes + 1];
	for (int i = 0; i < totalScopes + 1; i++) scopes[i] = i + 1;

	// Build the scope
	Scope scope;
	InitScope(&scope);
	scope.nodeLength = totalNodes;
	scope.nodes = nodes;
	scope.scopeLength = totalScopes;
	scope.scopes = scopes;

	scope.params = params;
	scope.paramItems = paramItems;
	scope.paramsLength = totalFuncs + totalFuncCalls;
	scope.paramItemsLength = totalParamItems;

	// Let's build the tree
	ParseStmtList(&scope, &lexer, scope.scopes[scope.scopeSpot++], false);
	scope.nodeSpot = 0;
	EnsureSemantics(&scope, 1);

	#if EXPAND_AST
	char* json = ExpandScope(&scope, 0);
	WriteToFile("compiled.json", json);
	#endif

	int totalVars = 0;
	for (int i = 0; i < scope.nodeLength; i++){
		if (scope.nodes[i].type == VAR ||
				scope.nodes[i].type == RETURN ||
				(scope.nodes[i].type > BEGIN_NUMBER && 
				 scope.nodes[i].type < END_STRING)) totalVars++;
	}

	Runner runner;
	RunnerContext runnerContexts[totalVars];
	runner.contexts = runnerContexts;
	bool contextUsed[totalVars];
	runner.contextUsed = contextUsed;

	for (int i = 0; i < totalVars; i++) {
		runner.contextUsed[i] = false;
	}

	runner.totalContexts = totalVars;
	InitRunner(&runner, &scope);
	Run(&runner, scope.scopes[0]);


	// Cleanup
	DestroyLexer(&lexer);
	DestroyNodes(nodes, totalNodes);
	DestroyScope(&scope);

	EndClock(&clock);
	DEBUG_PRINT("\n\n------Program Completed------\n");
	DEBUG_PRINT("\n\n------Program Stats------\n");
	#if DEBUG == 1
	printf("Time: %lld nanoseconds\n", GetClockNanosecond(&clock));
	
	#endif
}